

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O2

void __thiscall correctness_negation_long_Test::TestBody(correctness_negation_long_Test *this)

{
  char *pcVar1;
  AssertHelper AStack_108;
  AssertionResult gtest_ar;
  big_integer local_f0;
  string local_b8;
  string local_98;
  big_integer c;
  big_integer a;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"10000000000000000000000000000000000000000000000000000",
             (allocator<char> *)&c);
  big_integer::big_integer(&a,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"-10000000000000000000000000000000000000000000000000000",
             (allocator<char> *)&local_f0);
  big_integer::big_integer(&c,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  big_integer::operator-(&local_f0,&a);
  testing::internal::CmpHelperEQ<big_integer,big_integer>
            ((internal *)&gtest_ar,"-a","c",&local_f0,&c);
  big_integer::~big_integer(&local_f0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_f0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
               ,0x23c,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_108,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_108);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  big_integer::operator-(&local_f0,&c);
  testing::internal::CmpHelperEQ<big_integer,big_integer>
            ((internal *)&gtest_ar,"a","-c",&a,&local_f0);
  big_integer::~big_integer(&local_f0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_f0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
               ,0x23d,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_108,(Message *)&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_108);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_f0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  big_integer::~big_integer(&c);
  big_integer::~big_integer(&a);
  return;
}

Assistant:

TEST(correctness, negation_long)
{
    big_integer a( "10000000000000000000000000000000000000000000000000000");
    big_integer c("-10000000000000000000000000000000000000000000000000000");

    EXPECT_EQ(-a, c);
    EXPECT_EQ(a, -c);
}